

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

void des_xmlNodePtr(int no,xmlNodePtr val,int nr)

{
  if (no == 1) {
    xmlFreeDoc(api_doc);
    api_doc = (xmlDocPtr)0x0;
    api_dtd = (xmlDtdPtr)0x0;
    api_root = (xmlNodePtr)0x0;
    api_ns = (xmlNsPtr)0x0;
  }
  else if (val != (xmlNodePtr)0x0) {
    xmlUnlinkNode(val);
    xmlFreeNode(val);
    return;
  }
  return;
}

Assistant:

static void des_xmlNodePtr(int no, xmlNodePtr val, int nr ATTRIBUTE_UNUSED) {
    if (no == 1) {
        free_api_doc();
    } else if (val != NULL) {
        xmlUnlinkNode(val);
        xmlFreeNode(val);
    }
}